

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O1

void elf32_makestabs(GlobalVars *gv)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  uint32_t uVar5;
  node *pnVar6;
  node *pnVar7;
  node *pnVar8;
  node *pnVar9;
  nlist32 *n;
  LinkedSection *pLVar10;
  Reloc *r;
  nlist32 *n_00;
  size_t size;
  uint32_t *puVar11;
  bool bVar12;
  int local_48;
  
  bVar12 = elf_endianess == '\x01';
  stabdebugidx = 0;
  initlist(&stabcompunits);
  if (gv->strip_symbols == '\0') {
    pnVar6 = (gv->selobjects).first;
    if (pnVar6->next == (node *)0x0) {
      size = 0;
    }
    else {
      pnVar8 = (node *)0x0;
      size = 0;
      bVar4 = false;
      do {
        pnVar7 = remhead((list *)(pnVar6 + 5));
        while (pnVar7 != (node *)0x0) {
          if ((*(char *)&pnVar7[2].next == 'd') && (pnVar7[1].pred != (node *)0x0)) {
            if (!bVar4 && *(char *)&(pnVar7[1].pred)->next != '\0') {
              size = size + 0xc;
              pnVar8 = (node *)alloczero(0x68);
              initlist((list *)(pnVar8 + 2));
              pnVar8[5].pred = (node *)0x1000;
              addtail(&stabcompunits,pnVar8);
              bVar4 = true;
            }
          }
          else {
            bVar4 = false;
          }
          if (pnVar8 == (node *)0x0) {
            ierror("%s: N_SO missing","elf32_makestabs");
          }
          if ((node *)0x7ffe < pnVar8[1].pred) {
            ierror("%s: too many stab-entries for compilation unit","elf32_makestabs");
          }
          pnVar8[1].pred = (node *)((long)&(pnVar8[1].pred)->next + 1);
          if (pnVar7[1].pred == (node *)0x0) {
            pnVar9 = (node *)0x0;
          }
          else {
            uVar5 = elf_addstrlist((StrTabList *)&pnVar8[3].pred,(char *)pnVar7[1].pred);
            pnVar9 = (node *)(ulong)uVar5;
          }
          pnVar7[1].pred = pnVar9;
          if (bVar4) {
            pnVar8[1].next = pnVar9;
          }
          size = size + 0xc;
          addtail((list *)(pnVar8 + 2),pnVar7);
          pnVar7 = remhead((list *)(pnVar6 + 5));
        }
        pnVar6 = pnVar6->next;
      } while (pnVar6->next != (node *)0x0);
    }
    if (size != 0) {
      n = (nlist32 *)alloc(size);
      pLVar10 = find_lnksec(gv,".stab",'\0','\0','\0','\0');
      if (pLVar10 == (LinkedSection *)0x0) {
        pLVar10 = create_lnksect(gv,".stab",'\x02','\0','\x01','\x02',0);
      }
      else if (pLVar10->size != 0) {
        ierror("%s: .stab already in use","elf32_makestabs");
      }
      pLVar10->filesize = size;
      pLVar10->size = size;
      pLVar10->data = (uint8_t *)n;
      stabdebugidx = elf_addshdrstr(".stabstr");
      if ((stabcompunits.first)->next != (node *)0x0) {
        pnVar6 = stabcompunits.first;
        do {
          write_nlist((uint)bVar12,n,(long)pnVar6[1].next,'\0','\0',*(int16_t *)&pnVar6[1].pred,
                      *(uint32_t *)&pnVar6[6].next);
          n_00 = n + 1;
          pnVar8 = pnVar6[2].next;
          if (pnVar8->next != (node *)0x0) {
            puVar11 = &n[1].n_value;
            local_48 = 0;
            bVar4 = false;
            do {
              cVar2 = *(char *)&pnVar8[2].next;
              iVar3 = local_48;
              if (cVar2 == '$') {
                iVar3 = *(int *)((long)&pnVar8[2].next + 4);
                bVar4 = true;
                if (pnVar8[1].pred == (node *)0x0) {
                  *(int *)((long)&pnVar8[2].next + 4) = iVar3 - local_48;
                  pnVar8[1].next = (node *)0x0;
                  goto LAB_0011cee6;
                }
              }
              else if (cVar2 == 'D') {
                if (!bVar4) goto LAB_0011cee6;
                bVar4 = true;
                if (pnVar8[1].next != (node *)0x0) {
                  piVar1 = (int *)((long)&pnVar8[2].next + 4);
                  *piVar1 = *piVar1 - local_48;
                  pnVar8[1].next = (node *)0x0;
                }
              }
              else if (cVar2 == 'd') {
LAB_0011cee6:
                bVar4 = false;
                iVar3 = local_48;
              }
              local_48 = iVar3;
              if (pnVar8[1].next != (node *)0x0) {
                r = (Reloc *)alloczero(0x40);
                pnVar7 = pnVar8[1].next;
                piVar1 = (int *)((long)&pnVar8[2].next + 4);
                *piVar1 = *piVar1 + *(int *)&pnVar7[4].next;
                r->relocsect = (anon_union_8_4_462a49d9_for_relocsect)pnVar7[1].pred;
                r->offset = (long)puVar11 - (long)pLVar10->data;
                r->addend = (ulong)*(uint *)((long)&pnVar8[2].next + 4);
                r->rtype = '\x01';
                addreloc((Section *)0x0,r,0,0x20,-1);
                addtail(&pLVar10->relocs,(node *)r);
              }
              write_nlist((uint)bVar12,n_00,(long)pnVar8[1].pred,*(uint8_t *)&pnVar8[2].next,
                          *(int8_t *)((long)&pnVar8[2].next + 1),
                          *(int16_t *)((long)&pnVar8[2].next + 2),
                          *(uint32_t *)((long)&pnVar8[2].next + 4));
              n_00 = n_00 + 1;
              pnVar8 = pnVar8->next;
              puVar11 = puVar11 + 3;
            } while (pnVar8->next != (node *)0x0);
          }
          pnVar6 = pnVar6->next;
          n = n_00;
        } while (pnVar6->next != (node *)0x0);
      }
    }
  }
  return;
}

Assistant:

static void elf32_makestabs(struct GlobalVars *gv)
/* create .stab, .stabstr und .rela.stab sections from StabDebug records */
{
  static const char *fn = "elf32_makestabs";
  bool be = elf_endianess == _BIG_ENDIAN_;

  stabdebugidx = 0;
  initlist(&stabcompunits);

  if (gv->strip_symbols < STRIP_DEBUG) {
    struct StabCompUnit *cu = NULL;
    bool so_found = FALSE;
    struct LinkedSection *ls;
    struct ObjectUnit *obj;
    struct StabDebug *stab;
    unsigned long stabsize = 0;

    /* determine size of .stab section to generate */
    for (obj=(struct ObjectUnit *)gv->selobjects.first,stabsize=0;
         obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {

      while (stab=(struct StabDebug *)remhead(&obj->stabs)) {

        if (stab->n_type==N_SO && stab->name.ptr!=NULL) {
          if (*stab->name.ptr != '\0') {
            if (!so_found) {
              /* allocate and initialize new compilation unit */
              stabsize += sizeof(struct nlist32);  /* comp.unit header */
              cu = newCompUnit();
              addtail(&stabcompunits,&cu->n);
              so_found = TRUE;
            }
          }
        }
        else
          so_found = FALSE;

        if (cu == NULL)
          ierror("%s: N_SO missing",fn);
        if (cu->entries >= 0x7fff)
          ierror("%s: too many stab-entries for compilation unit",fn);
        stabsize += sizeof(struct nlist32);  /* stab entry */
        cu->entries++;

        /* register symbol name in comp.unit's string table */
        if (stab->name.ptr)
          stab->name.idx = elf_addstrlist(&cu->strtab,stab->name.ptr);
        else
          stab->name.idx = 0;

        if (so_found)
          cu->nameidx = stab->name.idx;  /* set comp.unit name */

        /* append stab entry to current comp.unit */
        addtail(&cu->stabs,&stab->n);
      }
    }

    if (stabsize) {
      /* create .stab section with contents for real */
      struct nlist32 *nlst = alloc(stabsize);

      if (ls = find_lnksec(gv,".stab",0,0,0,0)) {
        if (ls->size > 0)
          ierror("%s: .stab already in use",fn);
      }
      else
        ls = create_lnksect(gv,".stab",ST_DATA,0,SP_READ,2,0);
      ls->size = ls->filesize = stabsize;
      ls->data = (uint8_t *)nlst;

      /* allocate SHDR name for .stabstr */
      stabdebugidx = elf_addshdrstr(".stabstr");

      /* transfer nodes from compilation units to section's data area */
      for (cu=(struct StabCompUnit *)stabcompunits.first;
           cu->n.next!=NULL; cu=(struct StabCompUnit *)cu->n.next) {
        bool within_fun = FALSE;
        uint32_t fun_addr = 0;

        /* write compilation unit stab header containing number
           of stabs and length of string-table */
        write_nlist(be,nlst++,cu->nameidx,0,0,cu->entries,
                    cu->strtab.nextindex);

        /* write comp.unit's stabs */
        for (stab=(struct StabDebug *)cu->stabs.first;
             stab->n.next!=NULL; stab=(struct StabDebug *)stab->n.next) {

          switch (stab->n_type) {
            case N_SO:
              within_fun = FALSE;
              break;
            case N_FUN:
              if (stab->name.idx) {
                within_fun = TRUE;
                fun_addr = stab->n_value;
              }
              else {  /* function end address needs to be relative (size) */
                within_fun = FALSE;
                stab->n_value -= fun_addr;
                stab->relsect = NULL;
              }
              break;
            case N_SLINE:
              if (within_fun && stab->relsect) {
                /* convert address into a function-offset */
                stab->n_value -= fun_addr;
                stab->relsect = NULL;
              }
              break;
          }

          /* add relocation, if required */
          if (stab->relsect) {
            struct Reloc *r = alloczero(sizeof(struct Reloc));

            stab->n_value += stab->relsect->offset;
            r->relocsect.lnk = stab->relsect->lnksec;
            r->offset = (uint8_t *)&nlst->n_value - ls->data;
            r->addend = (lword)stab->n_value;
            r->rtype = R_ABS;
            addreloc(NULL,r,0,32,-1);
            addtail(&ls->relocs,&r->n);
          }

          /* write stab entry to section */
          write_nlist(be,nlst++,stab->name.idx,stab->n_type,
                      stab->n_othr,stab->n_desc,stab->n_value);
        }
      }
    }
  }
}